

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Matrix<double,_2,_2> * __thiscall
gl4cts::Math::outerProduct<2,2>
          (Matrix<double,_2,_2> *__return_storage_ptr__,Math *this,Vector<double,_2> *left,
          Vector<double,_2> *right)

{
  double dVar1;
  double *pdVar2;
  Matrix<double,_2,_2> local_78;
  uint local_58;
  uint local_54;
  GLuint i_1;
  GLuint i;
  undefined1 local_40 [8];
  Matrix<double,_1,_2> right_mat;
  Matrix<double,_2,_1> left_mat;
  Vector<double,_2> *right_local;
  Vector<double,_2> *left_local;
  Matrix<double,_2,_2> *result;
  
  tcu::Matrix<double,_2,_1>::Matrix((Matrix<double,_2,_1> *)(right_mat.m_data.m_data + 1));
  tcu::Matrix<double,_1,_2>::Matrix((Matrix<double,_1,_2> *)local_40);
  i_1._3_1_ = 0;
  tcu::Matrix<double,_2,_2>::Matrix(__return_storage_ptr__);
  for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
    pdVar2 = tcu::Vector<double,_2>::operator[]((Vector<double,_2> *)this,local_54);
    dVar1 = *pdVar2;
    pdVar2 = tcu::Matrix<double,_2,_1>::operator()
                       ((Matrix<double,_2,_1> *)(right_mat.m_data.m_data + 1),local_54,0);
    *pdVar2 = dVar1;
  }
  for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
    pdVar2 = tcu::Vector<double,_2>::operator[](left,local_58);
    dVar1 = *pdVar2;
    pdVar2 = tcu::Matrix<double,_1,_2>::operator()((Matrix<double,_1,_2> *)local_40,0,local_58);
    *pdVar2 = dVar1;
  }
  tcu::operator*(&local_78,(Matrix<double,_2,_1> *)(right_mat.m_data.m_data + 1),
                 (Matrix<double,_1,_2> *)local_40);
  tcu::Matrix<double,_2,_2>::operator=(__return_storage_ptr__,&local_78);
  tcu::Matrix<double,_2,_2>::~Matrix(&local_78);
  i_1._3_1_ = 1;
  tcu::Matrix<double,_1,_2>::~Matrix((Matrix<double,_1,_2> *)local_40);
  tcu::Matrix<double,_2,_1>::~Matrix((Matrix<double,_2,_1> *)(right_mat.m_data.m_data + 1));
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}